

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O3

void * NewtObjData(newtObjRef obj)

{
  newtObjRef pnVar1;
  
  pnVar1 = obj + 1;
  if (((obj->header).flags & 0x40) == 0) {
    pnVar1 = *(newtObjRef *)&pnVar1->header;
  }
  return pnVar1;
}

Assistant:

void * NewtObjData(newtObjRef obj)
{
    void *	data;
    
    data = (void *)(obj + 1);
    
    if (NewtObjIsLiteral(obj))
        return data;
    else
        return *((void **)data);
}